

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagebox.cpp
# Opt level: O0

void __thiscall
QtMWidgets::MessageBox::MessageBox(MessageBox *this,QString *title,QString *text,QWidget *parent)

{
  MessageBoxPrivate *pMVar1;
  Object local_48 [28];
  Int local_2c;
  QWidget *local_28;
  QWidget *parent_local;
  QString *text_local;
  QString *title_local;
  MessageBox *this_local;
  
  local_28 = parent;
  parent_local = (QWidget *)text;
  text_local = title;
  title_local = (QString *)this;
  local_2c = (Int)Qt::operator|(FramelessWindowHint,WindowStaysOnTopHint);
  QDialog::QDialog(&this->super_QDialog,parent,(QFlags_conflict1 *)(ulong)local_2c);
  *(undefined ***)this = &PTR_metaObject_00232778;
  *(undefined ***)&this->field_0x10 = &PTR__MessageBox_00232950;
  pMVar1 = (MessageBoxPrivate *)operator_new(0xa0);
  MessageBoxPrivate::MessageBoxPrivate(pMVar1,text_local,(QString *)parent_local,this,local_28);
  QScopedPointer<QtMWidgets::MessageBoxPrivate,_QScopedPointerDeleter<QtMWidgets::MessageBoxPrivate>_>
  ::QScopedPointer(&this->d,pMVar1);
  QWidget::setAttribute((ConnectionType)this,true);
  pMVar1 = QScopedPointer<QtMWidgets::MessageBoxPrivate,_QScopedPointerDeleter<QtMWidgets::MessageBoxPrivate>_>
           ::operator->(&this->d);
  QObject::connect<void(QAbstractButton::*)(bool),void(QtMWidgets::MessageBox::*)()>
            (local_48,(offset_in_QAbstractButton_to_subr)pMVar1->okButton,
             (Object *)QAbstractButton::clicked,0,(ConnectionType)this);
  QMetaObject::Connection::~Connection((Connection *)local_48);
  pMVar1 = QScopedPointer<QtMWidgets::MessageBoxPrivate,_QScopedPointerDeleter<QtMWidgets::MessageBoxPrivate>_>
           ::operator->(&this->d);
  MessageBoxPrivate::adjustSize(pMVar1);
  return;
}

Assistant:

MessageBox::MessageBox( const QString & title,
	const QString & text, QWidget * parent )
	:	QDialog( parent, Qt::FramelessWindowHint | Qt::WindowStaysOnTopHint )
	,	d( new MessageBoxPrivate( title, text, this, parent ) )
{
	setAttribute( Qt::WA_MacAlwaysShowToolWindow, true );

	connect( d->okButton, &MsgBoxButton::clicked,
		this, &MessageBox::_q_clicked );

	d->adjustSize();
}